

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O2

int __thiscall CMKDCommand::doWhat(CMKDCommand *this,CClient *pClient)

{
  EFTPSTATE EVar1;
  int iVar2;
  allocator local_1079;
  string ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1038;
  string ret;
  
  EVar1 = CClient::GetClientState(pClient);
  if ((int)EVar1 < 3) {
    std::__cxx11::string::string
              ((string *)&ret,"530 Please login with USER and PASS.\r\n",(allocator *)&ret_1);
    CClient::sendMsg(pClient,&ret);
  }
  else {
    CClient::GetUserDir_abi_cxx11_(&ret,pClient);
    chdir(ret._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&ret);
    iVar2 = mkdir((this->super_CCommand).m_Args._M_dataplus._M_p,0x1fd);
    if (iVar2 == 0) {
      chdir((this->super_CCommand).m_Args._M_dataplus._M_p);
      bzero(&ret,0x1000);
      getcwd((char *)&ret,0x1000);
      std::__cxx11::string::string((string *)&local_1058,(char *)&ret,&local_1079);
      std::operator+(&local_1038,"257 \"",&local_1058);
      std::operator+(&ret_1,&local_1038,"\" created.\r\n");
      std::__cxx11::string::~string((string *)&local_1038);
      std::__cxx11::string::~string((string *)&local_1058);
      CClient::sendMsg(pClient,&ret_1);
      std::__cxx11::string::~string((string *)&ret_1);
      return 1;
    }
    std::__cxx11::string::string
              ((string *)&ret,"550 Create directory operation failed.\r\n",(allocator *)&ret_1);
    CClient::sendMsg(pClient,&ret);
  }
  std::__cxx11::string::~string((string *)&ret);
  return -1;
}

Assistant:

int CMKDCommand::doWhat(CClient *pClient) {
    if(pClient->GetClientState() >= PASS){
        chdir(pClient->GetUserDir().c_str());
        if(0 == mkdir(m_Args.c_str(), S_IRWXU | S_IRWXG | S_IROTH | S_IXOTH)){
            chdir(m_Args.c_str());
            char buffer[BUFFER_SIZE];
            bzero(buffer,BUFFER_SIZE);
            getcwd(buffer,BUFFER_SIZE);
            string ret = "257 \"" + string(buffer) + "\" created.\r\n";
            pClient->sendMsg(ret);
            return 1;
        }
        else {
            string ret = "550 Create directory operation failed.\r\n";
            pClient->sendMsg(ret);
            return -1;
        }
    }
    else{
        string ret = "530 Please login with USER and PASS.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}